

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O2

google_protobuf_FieldDescriptorProto * fielddef_toproto(upb_ToProto_Context *ctx,upb_FieldDef *f)

{
  byte bVar1;
  upb_Arena *a;
  _Bool _Var2;
  uint32_t uVar3;
  google_protobuf_Edition gVar4;
  upb_Label value;
  upb_FieldType uVar5;
  upb_CType uVar6;
  upb_DecodeStatus uVar7;
  int iVar8;
  google_protobuf_FieldDescriptorProto *msg;
  char *pcVar9;
  upb_FileDef *puVar10;
  upb_MessageDef *puVar11;
  upb_EnumDef *puVar12;
  upb_OneofDef *o;
  google_protobuf_FieldOptions *msg_00;
  upb_Message *msg_01;
  long lVar13;
  byte *pbVar14;
  upb_EnumValueDef *v;
  byte *pbVar15;
  size_t i;
  size_t sVar16;
  float num;
  byte *pbVar17;
  size_t size_00;
  upb_StringView value_00;
  upb_MessageValue str;
  char *ptr;
  size_t local_48;
  byte *local_40;
  size_t size;
  
  msg = (google_protobuf_FieldDescriptorProto *)
        _upb_Message_New(&google__protobuf__FieldDescriptorProto_msg_init,ctx->arena);
  if (msg == (google_protobuf_FieldDescriptorProto *)0x0) goto LAB_0011c85c;
  pcVar9 = upb_FieldDef_Name(f);
  _ptr = strviewdup(ctx,pcVar9);
  upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130bac,&ptr);
  uVar3 = upb_FieldDef_Number(f);
  ptr._0_4_ = uVar3;
  upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130bb8,&ptr);
  _Var2 = upb_FieldDef_IsRequired(f);
  if (_Var2) {
    puVar10 = upb_FieldDef_File(f);
    gVar4 = upb_FileDef_Edition(puVar10);
    if (gVar4 < google_protobuf_EDITION_2023) goto LAB_0011c3b9;
    value = kUpb_Label_Optional;
  }
  else {
LAB_0011c3b9:
    value = upb_FieldDef_Label(f);
  }
  google_protobuf_FieldDescriptorProto_set_label(msg,value);
  uVar5 = upb_FieldDef_Type(f);
  if (uVar5 == kUpb_FieldType_Group) {
    puVar10 = upb_FieldDef_File(f);
    gVar4 = upb_FileDef_Edition(puVar10);
    if (gVar4 < google_protobuf_EDITION_2023) goto LAB_0011c3f4;
    uVar5 = kUpb_FieldType_Message;
  }
  else {
LAB_0011c3f4:
    uVar5 = upb_FieldDef_Type(f);
  }
  google_protobuf_FieldDescriptorProto_set_type(msg,uVar5);
  _Var2 = upb_FieldDef_HasJsonName(f);
  if (_Var2) {
    pcVar9 = upb_FieldDef_JsonName(f);
    _ptr = strviewdup(ctx,pcVar9);
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130bdc,&ptr);
  }
  _Var2 = upb_FieldDef_IsSubMessage(f);
  if (_Var2) {
    puVar11 = upb_FieldDef_MessageSubDef(f);
    pcVar9 = upb_MessageDef_FullName(puVar11);
LAB_0011c47b:
    value_00 = qual_dup(ctx,pcVar9);
    google_protobuf_FieldDescriptorProto_set_type_name(msg,value_00);
  }
  else {
    uVar6 = upb_FieldDef_CType(f);
    if (uVar6 == kUpb_CType_Enum) {
      puVar12 = upb_FieldDef_EnumSubDef(f);
      pcVar9 = upb_EnumDef_FullName(puVar12);
      goto LAB_0011c47b;
    }
  }
  _Var2 = upb_FieldDef_IsExtension(f);
  if (_Var2) {
    puVar11 = upb_FieldDef_ContainingType(f);
    pcVar9 = upb_MessageDef_FullName(puVar11);
    _ptr = qual_dup(ctx,pcVar9);
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130bf4,&ptr);
  }
  _Var2 = upb_FieldDef_HasDefault(f);
  if (!_Var2) goto LAB_0011c5c0;
  str = upb_FieldDef_Default(f);
  pbVar17 = (byte *)str.str_val.data;
  uVar6 = upb_FieldDef_CType(f);
  num = str.float_val;
  if ((uVar6 == kUpb_CType_Double) || (uVar6 == kUpb_CType_Float)) {
    pbVar14 = pbVar17;
    if (uVar6 == kUpb_CType_Float) {
      pbVar14 = (byte *)(double)num;
    }
    if ((double)pbVar14 < INFINITY) {
      if (-INFINITY < (double)pbVar14) {
        if (!NAN((double)pbVar14)) goto LAB_0011c555;
        pcVar9 = "nan";
      }
      else {
        pcVar9 = "-inf";
      }
    }
    else {
      pcVar9 = "inf";
    }
    goto LAB_0011c59d;
  }
LAB_0011c555:
  local_40 = (byte *)CONCAT44(local_40._4_4_,num);
  uVar6 = upb_FieldDef_CType(f);
  switch(uVar6) {
  case kUpb_CType_Bool:
    pcVar9 = "false";
    if (((undefined1  [16])str & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar9 = "true";
    }
    goto LAB_0011c59d;
  case kUpb_CType_Float:
    pbVar17 = (byte *)(double)local_40._0_4_;
    pcVar9 = "%.9g";
    goto LAB_0011c802;
  case kUpb_CType_Int32:
    pcVar9 = "%d";
    goto LAB_0011c827;
  case kUpb_CType_UInt32:
    pcVar9 = "%u";
LAB_0011c827:
    _ptr = printf_dup(ctx,pcVar9,(ulong)pbVar17 & 0xffffffff);
    break;
  case kUpb_CType_Enum:
    puVar12 = upb_FieldDef_EnumSubDef(f);
    v = upb_EnumDef_FindValueByNumber(puVar12,(int32_t)num);
    pcVar9 = upb_EnumValueDef_Name(v);
LAB_0011c59d:
    _ptr = strviewdup(ctx,pcVar9);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/util/def_to_proto.c"
                  ,0xb7,"upb_StringView default_string(upb_ToProto_Context *, const upb_FieldDef *)"
                 );
  case kUpb_CType_Double:
    pcVar9 = "%.17g";
LAB_0011c802:
    _ptr = printf_dup(ctx,pcVar9,pbVar17);
    break;
  case kUpb_CType_Int64:
    pcVar9 = "%ld";
    goto LAB_0011c840;
  case kUpb_CType_UInt64:
    pcVar9 = "%lu";
LAB_0011c840:
    _ptr = printf_dup(ctx,pcVar9,pbVar17);
    break;
  case kUpb_CType_String:
    _ptr = strviewdup2(ctx,str.str_val);
    break;
  case kUpb_CType_Bytes:
    size_00 = 0;
    for (sVar16 = 0; str.str_val.size != sVar16; sVar16 = sVar16 + 1) {
      bVar1 = pbVar17[sVar16];
      iVar8 = special_escape(bVar1);
      lVar13 = (ulong)((char)bVar1 < ' ') * 3 + 1;
      if (-1 < iVar8) {
        lVar13 = 2;
      }
      size_00 = size_00 + lVar13;
    }
    pbVar14 = (byte *)upb_Arena_Malloc(ctx->arena,size_00);
    if (pbVar14 == (byte *)0x0) goto LAB_0011c85c;
    pbVar15 = pbVar17 + str.str_val.size;
    local_40 = pbVar14;
    while (pbVar17 < pbVar15) {
      bVar1 = *pbVar17;
      pbVar17 = pbVar17 + 1;
      iVar8 = special_escape(bVar1);
      if (iVar8 < 0) {
        if ((char)bVar1 < ' ') {
          *pbVar14 = 0x5c;
          pbVar14[1] = bVar1 >> 6 | 0x30;
          pbVar14[2] = bVar1 >> 3 & 7 | 0x30;
          pbVar14[3] = bVar1 & 7 | 0x30;
          pbVar14 = pbVar14 + 4;
        }
        else {
          *pbVar14 = bVar1;
          pbVar14 = pbVar14 + 1;
        }
      }
      else {
        *pbVar14 = 0x5c;
        pbVar14[1] = (byte)iVar8;
        pbVar14 = pbVar14 + 2;
      }
    }
    local_48 = size_00;
    ptr = (char *)local_40;
  }
  upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130c00,&ptr);
LAB_0011c5c0:
  o = upb_FieldDef_ContainingOneof(f);
  if (o != (upb_OneofDef *)0x0) {
    uVar3 = upb_OneofDef_Index(o);
    ptr._0_4_ = uVar3;
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130c0c,&ptr);
  }
  _Var2 = _upb_FieldDef_IsProto3Optional(f);
  if (_Var2) {
    ptr._0_1_ = 1;
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130c18,&ptr);
  }
  _Var2 = upb_FieldDef_HasOptions(f);
  if (!_Var2) {
    return msg;
  }
  msg_00 = upb_FieldDef_Options(f);
  upb_Encode(&msg_00->base_dont_copy_me__upb_internal_use_only,
             &google__protobuf__FieldOptions_msg_init,0,ctx->arena,&ptr,&size);
  pcVar9 = ptr;
  if (ptr != (char *)0x0) {
    a = ctx->arena;
    msg_01 = _upb_Message_New(&google__protobuf__FieldOptions_msg_init,a);
    if ((msg_01 != (upb_Message *)0x0) &&
       (uVar7 = upb_Decode(pcVar9,size,msg_01,&google__protobuf__FieldOptions_msg_init,
                           (upb_ExtensionRegistry *)0x0,0,a), uVar7 == kUpb_DecodeStatus_Ok)) {
      ptr = (char *)msg_01;
      upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130c24,&ptr);
      return msg;
    }
  }
LAB_0011c85c:
  longjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static google_protobuf_FieldDescriptorProto* fielddef_toproto(upb_ToProto_Context* ctx,
                                                     const upb_FieldDef* f) {
  google_protobuf_FieldDescriptorProto* proto =
      google_protobuf_FieldDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_FieldDescriptorProto_set_name(proto,
                                       strviewdup(ctx, upb_FieldDef_Name(f)));
  google_protobuf_FieldDescriptorProto_set_number(proto, upb_FieldDef_Number(f));

  if (upb_FieldDef_IsRequired(f) &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_label(
        proto, UPB_DESC(FieldDescriptorProto_LABEL_OPTIONAL));
  } else {
    google_protobuf_FieldDescriptorProto_set_label(proto, upb_FieldDef_Label(f));
  }
  if (upb_FieldDef_Type(f) == kUpb_FieldType_Group &&
      upb_FileDef_Edition(upb_FieldDef_File(f)) >= UPB_DESC(EDITION_2023)) {
    google_protobuf_FieldDescriptorProto_set_type(proto, kUpb_FieldType_Message);
  } else {
    google_protobuf_FieldDescriptorProto_set_type(proto, upb_FieldDef_Type(f));
  }

  if (upb_FieldDef_HasJsonName(f)) {
    google_protobuf_FieldDescriptorProto_set_json_name(
        proto, strviewdup(ctx, upb_FieldDef_JsonName(f)));
  }

  if (upb_FieldDef_IsSubMessage(f)) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_MessageSubDef(f))));
  } else if (upb_FieldDef_CType(f) == kUpb_CType_Enum) {
    google_protobuf_FieldDescriptorProto_set_type_name(
        proto, qual_dup(ctx, upb_EnumDef_FullName(upb_FieldDef_EnumSubDef(f))));
  }

  if (upb_FieldDef_IsExtension(f)) {
    google_protobuf_FieldDescriptorProto_set_extendee(
        proto,
        qual_dup(ctx, upb_MessageDef_FullName(upb_FieldDef_ContainingType(f))));
  }

  if (upb_FieldDef_HasDefault(f)) {
    google_protobuf_FieldDescriptorProto_set_default_value(proto,
                                                  default_string(ctx, f));
  }

  const upb_OneofDef* o = upb_FieldDef_ContainingOneof(f);
  if (o) {
    google_protobuf_FieldDescriptorProto_set_oneof_index(proto, upb_OneofDef_Index(o));
  }

  if (_upb_FieldDef_IsProto3Optional(f)) {
    google_protobuf_FieldDescriptorProto_set_proto3_optional(proto, true);
  }

  if (upb_FieldDef_HasOptions(f)) {
    SET_OPTIONS(proto, FieldDescriptorProto, FieldOptions,
                upb_FieldDef_Options(f));
  }

  return proto;
}